

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_221797::ConstPubkeyProvider::GetPubKey
          (ConstPubkeyProvider *this,int pos,SigningProvider *arg,CPubKey *key,KeyOriginInfo *info,
          DescriptorCache *read_cache,DescriptorCache *write_cache)

{
  long lVar1;
  pointer puVar2;
  undefined1 *this_00;
  long in_FS_OFFSET;
  CKeyID keyid;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_PubkeyProvider).field_0xc;
  memcpy(key,this_00,0x41);
  puVar2 = (info->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((info->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (info->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  CPubKey::GetID(&keyid,(CPubKey *)this_00);
  *(undefined4 *)info->fingerprint = keyid.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetPubKey(int pos, const SigningProvider& arg, CPubKey& key, KeyOriginInfo& info, const DescriptorCache* read_cache = nullptr, DescriptorCache* write_cache = nullptr) const override
    {
        key = m_pubkey;
        info.path.clear();
        CKeyID keyid = m_pubkey.GetID();
        std::copy(keyid.begin(), keyid.begin() + sizeof(info.fingerprint), info.fingerprint);
        return true;
    }